

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O2

char * tokenise_search_path(char *searchpath)

{
  char *__s1;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *__s;
  
  __s = "";
  if (searchpath != (char *)0x0) {
    __s = searchpath;
  }
  sVar2 = strlen(__s);
  pcVar3 = (char *)malloc(sVar2 + 5);
  if (pcVar3 != (char *)0x0) {
    uVar9 = 0;
    uVar5 = 0;
    while (iVar1 = (int)uVar5, uVar5 < sVar2) {
      if ((uVar5 < sVar2 - 1) && (__s[uVar5] == ':')) {
        uVar4 = iVar1 + 1;
        cVar6 = ':';
        if (__s[uVar4] != ':') goto LAB_0012d08e;
LAB_0012d203:
        uVar5 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        pcVar3[uVar5] = cVar6;
      }
      else {
LAB_0012d08e:
        if ((iVar1 == 0) || (__s[iVar1 - 1] == ':')) {
          __s1 = __s + uVar5;
          iVar1 = strncmp(__s1,"http:",5);
          if ((iVar1 == 0) ||
             ((((iVar1 = strncmp(__s1,"ftp:",4), iVar1 == 0 ||
                (iVar1 = strncmp(__s1,"|http:",6), iVar1 == 0)) ||
               (iVar1 = strncmp(__s1,"|ftp:",5), iVar1 == 0)) ||
              ((iVar1 = strncmp(__s1,"URL=http:",9), iVar1 == 0 ||
               (iVar1 = strncmp(__s1,"URL=ftp:",8), iVar1 == 0)))))) {
            do {
              uVar8 = uVar9;
              uVar4 = (uint)uVar5;
              cVar6 = __s[uVar5];
              pcVar3[uVar8] = cVar6;
              if (sVar2 <= uVar5) goto LAB_0012d162;
              uVar4 = uVar4 + 1;
              uVar5 = (ulong)uVar4;
              uVar9 = uVar8 + 1;
            } while (cVar6 != ':');
            cVar6 = __s[uVar5];
LAB_0012d162:
            uVar4 = (cVar6 == ':') + uVar4;
            uVar5 = (ulong)uVar4;
            uVar7 = (ulong)(uVar8 + 1);
            if (__s[uVar5] == '/') {
              uVar5 = (ulong)(uVar4 + 1);
              uVar7 = (ulong)(uVar8 + 2);
              pcVar3[uVar8 + 1] = '/';
              if (__s[uVar5] == '/') {
                uVar5 = (ulong)(uVar4 + 2);
                pcVar3[uVar7] = '/';
                uVar7 = (ulong)(uVar8 + 3);
              }
            }
            cVar6 = __s[uVar5];
            uVar9 = (int)uVar5 + 3;
            do {
              uVar4 = uVar9;
              pcVar3[uVar7] = cVar6;
              cVar6 = __s[uVar4 - 2];
              iVar1 = (int)uVar7;
              if ((sVar2 <= uVar4 - 2) || (cVar6 == ':')) break;
              uVar7 = (ulong)(iVar1 + 1);
              uVar9 = uVar4 + 1;
            } while (cVar6 != '/');
            uVar5 = (ulong)(uVar4 - 1);
            uVar9 = iVar1 + 2;
            pcVar3[iVar1 + 1] = cVar6;
            if (__s[uVar5] == ':') {
              uVar5 = (ulong)uVar4;
            }
          }
        }
        uVar4 = (uint)uVar5;
        cVar6 = __s[uVar5];
        if (cVar6 != ':') goto LAB_0012d203;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else if (pcVar3[uVar9 - 1] != '\0') {
          cVar6 = '\0';
          goto LAB_0012d203;
        }
      }
      uVar5 = (ulong)(uVar4 + 1);
    }
    if (uVar9 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = uVar9 + 1;
      pcVar3[uVar9] = '\0';
    }
    pcVar3[uVar4] = '.';
    pcVar3[uVar4 + 1] = '/';
    pcVar3[uVar4 + 2] = '\0';
    pcVar3[uVar4 + 3] = '\0';
  }
  return pcVar3;
}

Assistant:

char *tokenise_search_path(char *searchpath) {
    char *newsearch;
    unsigned int i, j;
    size_t len;
#ifdef _WIN32
    char path_sep = ';';
#else
    char path_sep = ':';
#endif

    if (!searchpath)
	searchpath="";

    newsearch = (char *)malloc((len = strlen(searchpath))+5);
    if (!newsearch)
	return NULL;

    for (i = 0, j = 0; i < len; i++) {
	/* "::" => ":". Used for escaping colons in http://foo */
	if (i < len-1 && searchpath[i] == ':' && searchpath[i+1] == ':') {
	    newsearch[j++] = ':';
	    i++;
	    continue;
	}

	/* Handle http:// and ftp:// too without :: */
	if (path_sep == ':') {
	    if ((i == 0 || (i > 0 && searchpath[i-1] == ':')) &&
		(!strncmp(&searchpath[i], "http:",     5) ||
		 !strncmp(&searchpath[i], "ftp:",      4) ||
		 !strncmp(&searchpath[i], "|http:",    6) ||
		 !strncmp(&searchpath[i], "|ftp:",     5) ||
		 !strncmp(&searchpath[i], "URL=http:", 9) ||
		 !strncmp(&searchpath[i], "URL=ftp:",  8))) {
		do {
		    newsearch[j++] = searchpath[i];
		} while (i<len && searchpath[i++] != ':');
		if (searchpath[i] == ':')
		    i++;
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		// Look for host:port
		do {
		    newsearch[j++] = searchpath[i++];
		} while (i<len && searchpath[i] != ':' && searchpath[i] != '/');
		newsearch[j++] = searchpath[i++];
		if (searchpath[i] == ':')
		    i++;
	    }
	}

	if (searchpath[i] == path_sep) {
	    /* Skip blank path components */
	    if (j && newsearch[j-1] != 0)
		newsearch[j++] = 0;
	} else {
	    newsearch[j++] = searchpath[i];
	}
    }

    if (j)
	newsearch[j++] = 0;
    newsearch[j++] = '.';
    newsearch[j++] = '/';
    newsearch[j++] = 0;
    newsearch[j++] = 0;
    
    return newsearch;
}